

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

unsigned_long
pstore::serialize::
read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
          (range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *archive)

{
  uint8_t in_RAX [8];
  uint8_t auVar1 [8];
  type uninit_buffer;
  type local_18;
  
  local_18._ = in_RAX;
  flood<pstore::serialize::details::aligned_storage<8ul,8ul>::type>(&local_18);
  serialize::archive::
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::get<unsigned_long>(archive,(unsigned_long *)&local_18);
  auVar1[0] = local_18._[0];
  auVar1[1] = local_18._[1];
  auVar1[2] = local_18._[2];
  auVar1[3] = local_18._[3];
  auVar1[4] = local_18._[4];
  auVar1[5] = local_18._[5];
  auVar1[6] = local_18._[6];
  auVar1[7] = local_18._[7];
  return (unsigned_long)auVar1;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }